

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O3

uint8_t fio_cluster_on_shutdown(intptr_t uuid,fio_protocol_s *pr_)

{
  _func_uint8_t_intptr_t_fio_protocol_s_ptr *p_Var1;
  fio_str_info_s ch;
  fio_msg_internal_s *pfVar2;
  char *unaff_RBX;
  fio_str_info_s in_stack_00000000;
  
  p_Var1 = pr_[1].on_shutdown;
  ch.data = unaff_RBX;
  ch.capa = SUB168(ZEXT816(1) << 0x40,0);
  ch.len = SUB168(ZEXT816(1) << 0x40,8);
  pfVar2 = fio_msg_internal_create(0,8,ch,in_stack_00000000,'\0','\0');
  (*p_Var1)((intptr_t)pfVar2,(fio_protocol_s *)0xffffffffffffffff);
  return 0xff;
}

Assistant:

static uint8_t fio_cluster_on_shutdown(intptr_t uuid, fio_protocol_s *pr_) {
  cluster_pr_s *p = (cluster_pr_s *)pr_;
  p->sender(fio_msg_internal_create(0, FIO_CLUSTER_MSG_SHUTDOWN,
                                    (fio_str_info_s){.len = 0},
                                    (fio_str_info_s){.len = 0}, 0, 1),
            -1);
  return 255;
  (void)pr_;
  (void)uuid;
}